

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O3

u32 u32NegInv(u32 w)

{
  int iVar1;
  u32 ret;
  
  iVar1 = (w * w | 2) * w;
  iVar1 = (iVar1 * w + 2) * iVar1;
  iVar1 = (iVar1 * w + 2) * iVar1;
  iVar1 = (iVar1 * w + 2) * iVar1;
  return (w * iVar1 + 2) * iVar1;
}

Assistant:

u32 u32NegInv(register u32 w)
{
	register u32 ret = w;
	ASSERT(w & 1);
	// для t = 1,...,k: ret <- ret * (w * ret + 2)
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	w = 0;
	return ret;
}